

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

int quick_stack_check(void)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  DLword *pDVar4;
  DLword DVar5;
  DLword DVar6;
  LispPTR LVar7;
  LispPTR LVar8;
  ulong uVar9;
  long lVar10;
  char *s;
  ushort *puVar11;
  ushort *puVar12;
  DLword local_3a;
  undefined2 local_38;
  undefined2 local_36;
  
  DVar6 = MachineState.pvar[-5];
  DVar5 = StackOffsetFromNative(MachineState.csp);
  if ((DVar6 == DVar5) && (MachineState.csp[1] == 0xa000)) {
    bVar3 = true;
  }
  else {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      LVar7 = LAddrFromNative(MachineState.pvar + -10);
      LVar8 = LAddrFromNative(MachineState.csp);
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",(ulong)LVar7,(ulong)LVar8);
      return 1;
    }
    local_3a = MachineState.pvar[-5];
    local_36 = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_38 = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    DVar6 = StackOffsetFromNative(MachineState.csp + 2);
    MachineState.pvar[-5] = DVar6;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)(((int)MachineState.endofstack - (int)MachineState.csp) - 4U >> 1);
    bVar3 = false;
  }
  pDVar4 = Stackspace;
  uVar1 = InterfacePage->stackbase;
  puVar12 = Stackspace + InterfacePage->endofstack;
  if (*(ushort *)((ulong)puVar12 ^ 2) < 0xe000) {
    puts("?? endstack is not GUARD BLK");
  }
  puVar11 = pDVar4 + uVar1;
  do {
    if (puVar12 <= puVar11) {
      if (!bVar3) {
        MachineState.pvar[-5] = local_3a;
        *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_36;
        *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_38;
      }
      return 0;
    }
    uVar2 = *(ushort *)((ulong)puVar11 ^ 2) >> 0xd;
    if (uVar2 == 5) {
      uVar9 = (ulong)*puVar11;
      if (uVar9 == 0) {
        s = "FSB freesize = 0!";
LAB_001264c3:
        warn(s);
        return 1;
      }
LAB_00126333:
      puVar11 = puVar11 + uVar9;
    }
    else {
      if (uVar2 != 6) {
        if (uVar2 != 7) {
          for (lVar10 = 0; puVar12 = (ushort *)((long)puVar11 + lVar10 ^ 2), *puVar12 < 0x2000;
              lVar10 = lVar10 + 4) {
          }
          warn("StackCheck:!=STK_NOTFLG");
          printf("content:0x%x\n",(ulong)*puVar12);
          return 1;
        }
        uVar9 = (ulong)*puVar11;
        if (uVar9 == 0) {
          s = "Guard block freesize = 0!";
          goto LAB_001264c3;
        }
        goto LAB_00126333;
      }
      puVar11 = (ushort *)((ulong)((uint)puVar11[5] * 2) + (long)Stackspace);
    }
    if ((puVar11 != pDVar4 + uVar1) && (puVar12 < puVar11)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",puVar11,puVar12);
    }
  } while( true );
}

Assistant:

int quick_stack_check(void) {
  StackWord *start68k;
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

#ifdef FSBCHECK
  bigFSBindex = 0;
  memset((char *)bigFSB, 0, sizeof(bigFSB));
#endif

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
      return(1);
    }
    setflg = T;
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  scanptr68k = start68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  if (STKWORD(endstack68k)->flags != STK_GUARD) printf("?? endstack is not GUARD BLK\n");

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) {
          warn("FSB freesize = 0!");
          return(1);
        }
#ifdef FSBCHECK
        if (freesize > STACKAREA_SIZE + MINEXTRASTACKWORDS) {
          if (bigFSBindex < 100) {
            bigFSB[bigFSBindex].offset = StackOffsetFromNative(scanptr68k);
            bigFSB[bigFSBindex].size = freesize;
            bigFSBindex++;
          }
        }
#endif
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        break;
      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) {
          warn("Guard block freesize = 0!");
          return(1);
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        break;
      case STK_FX:
        CHECK_FX((FX *)scanptr68k);
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        break;
      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            warn("StackCheck:!=STK_NOTFLG");
            printf("content:0x%x\n", GETWORD((DLword *)scanptr68k));
            return(1);
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        CHECK_BF((Bframe *)scanptr68k);
        if (((Bframe *)scanptr68k)->residual) {
          if ((DLword *)scanptr68k != top_ivar)
            printf("Residual has real IVAR:0x%x\n", LAddrFromNative(scanptr68k));
        } else {
          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(scanptr68k));
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        break;
    } /*switch end */
    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */
#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif

  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }
  return(0);

}